

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

atom * orientedAtoms(xformDatabase *xdb)

{
  long lVar1;
  atom *paVar2;
  matrix4 *__src;
  int local_134;
  int i;
  atom *a;
  atom *alst;
  matrix4 rsltMat;
  matrix4 ctm;
  xformAtomRecords *xa;
  transformData *xform;
  xformDatabase *xdb_local;
  
  a = (atom *)0x0;
  if (xdb != (xformDatabase *)0x0) {
    initializeXFStack(xdb);
    v3identityMat((matrix4 *)(rsltMat.element[3] + 3));
    for (xa = (xformAtomRecords *)xdb->xforms; xa != (xformAtomRecords *)0x0; xa = xa->next) {
      if (*(int *)((long)&(xa->loc).z + 4) == 3) {
        pushXFStack(xdb,(matrix4 *)(rsltMat.element[3] + 3));
      }
      else if (*(int *)((long)&(xa->loc).z + 4) == 4) {
        __src = topXFStack(xdb);
        memcpy(rsltMat.element[3] + 3,__src,0x80);
        popXFStack(xdb);
      }
      else if (xa != (xformAtomRecords *)0x0) {
        v3matMul((matrix4 *)&xa[3].a,(matrix4 *)(rsltMat.element[3] + 3),(matrix4 *)&alst);
        memcpy(rsltMat.element[3] + 3,&alst,0x80);
      }
      for (ctm.element[3][3] = (double)xa->a; ctm.element[3][3] != 0.0;
          ctm.element[3][3] = *(double *)ctm.element[3][3]) {
        lVar1 = *(long *)((long)ctm.element[3][3] + 8);
        *(undefined8 *)(lVar1 + 0x38) = *(undefined8 *)((long)ctm.element[3][3] + 0x10);
        *(undefined8 *)(lVar1 + 0x40) = *(undefined8 *)((long)ctm.element[3][3] + 0x18);
        *(undefined8 *)(lVar1 + 0x48) = *(undefined8 *)((long)ctm.element[3][3] + 0x20);
        v3mulPointMat((point3d *)(lVar1 + 0x38),(matrix4 *)(rsltMat.element[3] + 3));
      }
    }
    a = (atom *)0x0;
    if (xdb->sortedByRes != (xformAtomRecords **)0x0) {
      for (local_134 = 0; xdb->sortedByRes[local_134] != (xformAtomRecords *)0x0;
          local_134 = local_134 + 1) {
        paVar2 = xdb->sortedByRes[local_134]->a;
        paVar2->next = a;
        a = paVar2;
      }
    }
  }
  return a;
}

Assistant:

atom* orientedAtoms(xformDatabase* xdb) {
   transformData* xform = NULL;
   xformAtomRecords* xa = NULL;
   matrix4 ctm, rsltMat;
   atom* alst = NULL, *a = NULL;

   if (xdb) {
      initializeXFStack(xdb);

      v3identityMat(&ctm);

      for (xform = xdb->xforms; xform; xform = xform->next) {
	 if (xform->type == SAVExform) {
	       pushXFStack(xdb, &ctm);
	 }
	 else if (xform->type == RESTORExform) {
	    ctm = * topXFStack(xdb);
	    popXFStack(xdb);
	 }
	 else if (xform != NULLxform) {
	    v3matMul(&(xform->tmat), &ctm, &rsltMat);
	    ctm = rsltMat;
	 }

	 for(xa = xform->recs; xa; xa = xa->next) {
	    a = xa->a;

	    a->loc = xa->loc;                /* apply ctm to the original loc of each atom  */
	    v3mulPointMat(&(a->loc), &ctm); /* and use to set the new position of the atom */
	 }
      }

      alst = NULL;
      if (xdb->sortedByRes) { /* (re-)compose the atom list from the sort index */
	 int i = 0;
	 for(i=0; xdb->sortedByRes[i]; i++) {
	    a = xdb->sortedByRes[i]->a;
	    a->next = alst;
	    alst = a;
	 }
      }
   }

   return alst; /* returns the list of (pre-)sorted atoms */
}